

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O0

void __thiscall
WavingSketch<8U,_16U,_4U>::Check
          (WavingSketch<8U,_16U,_4U> *this,HashMap<4U> *mp,
          vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
          *outs)

{
  bool bVar1;
  pointer ppVar2;
  const_reference ppbVar3;
  ostream *poVar4;
  int iVar5;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *in_RDX;
  long *in_RDI;
  int size;
  int hit;
  int all;
  int value;
  iterator it;
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  *in_stack_ffffffffffffff88;
  _Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *in_stack_ffffffffffffff90;
  double dVar6;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_40;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_20;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *local_18;
  
  local_18 = in_RDX;
  std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::_Node_iterator
            ((_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)0x11259c);
  local_24 = 0;
  local_28 = 0;
  local_2c = 0;
  local_30 = 0;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
       ::begin(in_stack_ffffffffffffff88);
  local_20._M_cur = local_38._M_cur;
  while( true ) {
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
         ::end(in_stack_ffffffffffffff88);
    bVar1 = std::__detail::operator!=(&local_20,&local_40);
    if (!bVar1) break;
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::operator->
                       ((_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)0x112606);
    local_24 = (**(code **)(*in_RDI + 0x18))(in_RDI,ppVar2);
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::operator->
                       ((_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)0x112622);
    if (((int)in_RDI[0xd] < ppVar2->second) &&
       (local_28 = local_28 + 1, (int)in_RDI[0xd] < local_24)) {
      local_2c = local_2c + 1;
      ppVar2 = std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)0x112665);
      iVar5 = ppVar2->second - local_24;
      if (iVar5 < 1) {
        iVar5 = -iVar5;
      }
      in_RDI[7] = (long)((double)iVar5 + (double)in_RDI[7]);
      ppVar2 = std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)0x112693);
      iVar5 = ppVar2->second - local_24;
      if (iVar5 < 1) {
        iVar5 = -iVar5;
      }
      ppVar2 = std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)0x1126b5);
      in_RDI[8] = (long)((double)iVar5 / (double)ppVar2->second + (double)in_RDI[8]);
    }
    if ((int)in_RDI[0xd] < local_24) {
      local_30 = local_30 + 1;
    }
    std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::operator++
              (in_stack_ffffffffffffff90);
  }
  in_RDI[7] = (long)((double)in_RDI[7] / (double)local_2c);
  in_RDI[8] = (long)((double)in_RDI[8] / (double)local_2c);
  in_RDI[6] = (long)((double)local_2c / (double)local_28);
  in_RDI[5] = (long)((double)local_2c / (double)local_30);
  ppbVar3 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_18,0);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar3,(double)in_RDI[8]);
  std::operator<<(poVar4,",");
  ppbVar3 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_18,1);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar3,(double)in_RDI[6]);
  std::operator<<(poVar4,",");
  ppbVar3 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_18,2);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar3,(double)in_RDI[5]);
  std::operator<<(poVar4,",");
  ppbVar3 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_18,3);
  if (1e-06 <= (double)in_RDI[6] + (double)in_RDI[5]) {
    dVar6 = (double)in_RDI[6] + (double)in_RDI[5];
  }
  else {
    dVar6 = 1.0;
  }
  poVar4 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)*ppbVar3,((double)in_RDI[5] * 2.0 * (double)in_RDI[6]) / dVar6);
  std::operator<<(poVar4,",");
  return;
}

Assistant:

virtual void Check(HashMap<DATA_LEN> mp, const std::vector<std::ostream*>& outs) {
		typename HashMap<DATA_LEN>::iterator it;
		int value = 0, all = 0, hit = 0, size = 0;
		for (it = mp.begin(); it != mp.end(); ++it) {
			value = QueryTopK(it->first);
			if (it->second > this->HIT) {
				all++;
				if (value > this->HIT) {
					hit += 1;
					this->aae += abs(it->second - value);
					this->are += abs(it->second - value) / (double)it->second;
				}
			}
			if (value > this->HIT) size += 1;
		}
		this->aae /= hit;
		this->are /= hit;
		this->cr = hit / (double)all;
		this->pr = hit / (double)size;
		*outs[0] << this->are << ",";
		*outs[1] << this->cr << ",";
		*outs[2] << this->pr << ",";
		*outs[3] << 2 * this->pr * this->cr / ((this->cr + this->pr < 1e-6) ? 1 : this->cr + this->pr) << ",";
	}